

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessGSOutStreamOperations
          (ConversionStream *this,iterator *Token,String *OutStreamName,char *EntryPoint)

{
  TokenListType *pTVar1;
  int iVar2;
  __type _Var3;
  bool bVar4;
  _List_node_base *p_Var5;
  int local_74;
  string msg;
  String local_50;
  
  if (*(int *)&Token->_M_node[1]._M_next != 0x133) {
    FormatString<char[26],char[36]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == TokenType::OpenBrace",(char (*) [36])EntryPoint);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ProcessGSOutStreamOperations",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xff6);
    std::__cxx11::string::~string((string *)&msg);
  }
  pTVar1 = &this->m_Tokens;
  local_74 = 1;
  do {
    while( true ) {
      while( true ) {
        p_Var5 = Token->_M_node->_M_next;
        Token->_M_node = p_Var5;
        if (p_Var5 == (_List_node_base *)pTVar1) {
          return;
        }
        iVar2 = *(int *)&p_Var5[1]._M_next;
        if (iVar2 != 0x13b) break;
        _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&p_Var5[1]._M_prev,OutStreamName);
        if (_Var3) {
          p_Var5 = Token->_M_node->_M_next;
          Token->_M_node = p_Var5;
          if (p_Var5 == (_List_node_base *)pTVar1) {
            FormatString<char[15]>(&msg,(char (*) [15])"Unexpected EOF");
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      (&local_50,this,Token,4);
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ProcessGSOutStreamOperations",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x100c,&msg,(char (*) [2])0x2c8293,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&msg);
            p_Var5 = Token->_M_node;
          }
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&p_Var5[1]._M_prev,".");
          if (!bVar4) {
            FormatString<char[13]>(&msg,(char (*) [13])"\'.\' expected");
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      (&local_50,this,Token,4);
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ProcessGSOutStreamOperations",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x100d,&msg,(char (*) [2])0x2c8293,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&msg);
          }
          std::__cxx11::string::assign((char *)&Token->_M_node[1]._M_prev);
          p_Var5 = Token->_M_node;
          p_Var5[4]._M_next = (_List_node_base *)0x0;
          *(undefined1 *)&(p_Var5[3]._M_prev)->_M_next = 0;
          p_Var5 = Token->_M_node->_M_next;
          Token->_M_node = p_Var5;
          if (p_Var5 == (_List_node_base *)pTVar1) {
            FormatString<char[15]>(&msg,(char (*) [15])"Unexpected EOF");
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      (&local_50,this,Token,4);
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ProcessGSOutStreamOperations",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x1015,&msg,(char (*) [2])0x2c8293,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&msg);
            p_Var5 = Token->_M_node;
          }
          p_Var5[4]._M_next = (_List_node_base *)0x0;
          *(undefined1 *)&(p_Var5[3]._M_prev)->_M_next = 0;
        }
      }
      if (iVar2 == 0x134) break;
      if (iVar2 == 0x133) {
        local_74 = local_74 + 1;
      }
    }
    local_74 = local_74 + -1;
  } while (local_74 != 0);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessGSOutStreamOperations(TokenListType::iterator& Token, const String& OutStreamName, const char* EntryPoint)
{
    VERIFY_EXPR(Token->Type == TokenType::OpenBrace);

    ++Token; // Skip open brace
    int BraceCount = 1;
    // Find matching closing brace
    while (Token != m_Tokens.end())
    {
        if (Token->Type == TokenType::OpenBrace)
            ++BraceCount;
        else if (Token->Type == TokenType::ClosingBrace)
        {
            --BraceCount;
            if (BraceCount == 0)
                break;
        }
        if (Token->Type == TokenType::Identifier && Token->Literal == OutStreamName)
        {
            // triStream.Append( Out );
            // ^
            ++Token;
            // triStream.Append( Out );
            //          ^
            VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF");
            VERIFY_PARSER_STATE(Token, Token->Literal == ".", "\'.\' expected");
            Token->Literal = "_";
            Token->Delimiter.clear();
            // triStream_Append( Out );
            //          ^
            ++Token;
            // triStream_Append( Out );
            //           ^
            VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF");
            Token->Delimiter.clear();
            ++Token;
        }
        else
            ++Token;
    }
}